

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap6_validate(FT_Byte *table,FT_Validator valid)

{
  uint local_28;
  FT_UInt gindex;
  FT_UInt count;
  FT_UInt length;
  FT_Byte *p;
  FT_Validator valid_local;
  FT_Byte *table_local;
  
  if (valid->limit < table + 10) {
    ft_validator_error(valid,8);
  }
  _count = table + 10;
  local_28 = (uint)CONCAT11(table[8],table[9]);
  if ((valid->limit < table + (uint)CONCAT11(table[2],table[3])) ||
     ((uint)CONCAT11(table[2],table[3]) < local_28 * 2 + 10)) {
    ft_validator_error(valid,8);
  }
  if (valid->level != FT_VALIDATE_DEFAULT) {
    for (; local_28 != 0; local_28 = local_28 - 1) {
      if ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)CONCAT11(*_count,_count[1])) {
        ft_validator_error(valid,0x10);
      }
      _count = _count + 2;
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap6_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length, count;


    if ( table + 10 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;
    length = TT_NEXT_USHORT( p );

    p      = table + 8;             /* skip language and start index */
    count  = TT_NEXT_USHORT( p );

    if ( table + length > valid->limit || length < 10 + count * 2 )
      FT_INVALID_TOO_SHORT;

    /* check glyph indices */
    if ( valid->level >= FT_VALIDATE_TIGHT )
    {
      FT_UInt  gindex;


      for ( ; count > 0; count-- )
      {
        gindex = TT_NEXT_USHORT( p );
        if ( gindex >= TT_VALID_GLYPH_COUNT( valid ) )
          FT_INVALID_GLYPH_ID;
      }
    }

    return FT_Err_Ok;
  }